

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Packetizer.cpp
# Opt level: O0

void anon_unknown.dwarf_762da::run(void)

{
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  IVar1;
  void *pvVar2;
  RbTreeNode<int,_int> *pRVar3;
  uint *puVar4;
  size_t i_1;
  size_t i;
  MapIteratorX<int,_int> it2;
  Iterator it;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> tree;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  itBase;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  itDerived;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  in_stack_fffffffffffffee8;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *in_stack_fffffffffffffef0;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  *in_stack_fffffffffffffef8;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffff00;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *in_stack_ffffffffffffff08;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *this;
  ulong local_a0;
  ulong local_80;
  IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  local_50 [7];
  undefined8 local_18;
  undefined8 local_10;
  
  this = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
          *)&stack0xfffffffffffffff8;
  axl::sl::
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
              *)0x125a89);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
              *)0x125a96);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,axl::sl::ListLink>>
  ::
  Iterator<(anonymous_namespace)::Derived,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,axl::sl::ListLink>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_10 = local_18;
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::RbTree
            (in_stack_fffffffffffffef0,(Cmp<int,_int> *)in_stack_fffffffffffffee8.m_p);
  axl::sl::
  Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)0x125ada);
  IVar1.m_p = (Entry *)axl::sl::
                       BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                       ::find(in_stack_ffffffffffffff08,
                              (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  for (local_80 = 0; local_80 < 0x32; local_80 = local_80 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::visit(this,(int)((ulong)IVar1.m_p >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    axl::sl::
    IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  *)in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  for (local_a0 = 0; local_a0 < 0x32; local_a0 = local_a0 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::eraseKey(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    in_stack_fffffffffffffee8.m_p =
         (Entry *)axl::sl::
                  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  ::operator++(in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::~RbTree
            ((RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *)0x125dbb);
  return;
}

Assistant:

void
run() {
	printf("test_Packetizer::Run ()\n");

	MyPacketizer packetizer;

	char data[] = "papapaapak:\xf\0\0\0pizda ivanovna";

	for (size_t i = 0; i < 64; i++) {
		char* p = data;
		size_t size = sizeof(data);

		size_t j = 0;
		for (; size; j++) {
			size_t chunkSize = rand() % (sizeof(data) + 1);
			if (chunkSize > size)
				chunkSize = size;

			packetizer.write(p, chunkSize);
			p += chunkSize;
			size -= chunkSize;
		}

		printf("complete (%d, %d chunks).\n", i, j);
	}

	sl::String s = "dsjsdljsdkl";
	s.clear();

	printf("done.\n");
}